

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Man.c
# Opt level: O3

void Llb_ManPrepareVarLimits(Llb_Man_t *p)

{
  Aig_Man_t *pAVar1;
  Llb_Mtr_t *pLVar2;
  Llb_Grp_t **ppLVar3;
  Llb_Grp_t *pLVar4;
  Vec_Ptr_t *pVVar5;
  void **ppvVar6;
  Vec_Ptr_t *pVVar7;
  undefined1 auVar8 [16];
  uint uVar9;
  Vec_Int_t *pVVar10;
  int *__s;
  Vec_Int_t *pVVar11;
  int *__s_00;
  long lVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  uint uVar17;
  int iVar19;
  undefined1 auVar18 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  int iVar23;
  
  if (p->vVarBegs != (Vec_Int_t *)0x0) {
    __assert_fail("p->vVarBegs == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Man.c"
                  ,0x5d,"void Llb_ManPrepareVarLimits(Llb_Man_t *)");
  }
  if (p->vVarEnds != (Vec_Int_t *)0x0) {
    __assert_fail("p->vVarEnds == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Man.c"
                  ,0x5e,"void Llb_ManPrepareVarLimits(Llb_Man_t *)");
  }
  pAVar1 = p->pAig;
  uVar13 = pAVar1->vObjs->nSize;
  pVVar10 = (Vec_Int_t *)malloc(0x10);
  uVar17 = uVar13 - 1;
  uVar9 = 0x10;
  if (0xe < uVar17) {
    uVar9 = uVar13;
  }
  pVVar10->nCap = uVar9;
  if (uVar9 == 0) {
    pVVar10->pArray = (int *)0x0;
    pVVar10->nSize = uVar13;
LAB_008249ee:
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)(int)uVar9 << 2);
    pVVar10->pArray = __s;
    pVVar10->nSize = uVar13;
    if (__s == (int *)0x0) goto LAB_008249ee;
    memset(__s,0,(long)(int)uVar13 << 2);
    uVar13 = pAVar1->vObjs->nSize;
    uVar17 = uVar13 - 1;
  }
  p->vVarEnds = pVVar10;
  pVVar11 = (Vec_Int_t *)malloc(0x10);
  uVar9 = 0x10;
  if (0xe < uVar17) {
    uVar9 = uVar13;
  }
  pVVar11->nCap = uVar9;
  if (uVar9 == 0) {
    pVVar11->pArray = (int *)0x0;
    pVVar11->nSize = uVar13;
  }
  else {
    __s_00 = (int *)malloc((long)(int)uVar9 << 2);
    pVVar11->pArray = __s_00;
    pVVar11->nSize = uVar13;
    if (__s_00 != (int *)0x0) {
      memset(__s_00,0,(long)(int)uVar13 << 2);
      uVar13 = pAVar1->vObjs->nSize;
      goto LAB_00824a70;
    }
  }
  __s_00 = (int *)0x0;
LAB_00824a70:
  p->vVarBegs = pVVar11;
  pLVar2 = p->pMatrix;
  iVar14 = pLVar2->nCols;
  if ((int)uVar9 < (int)uVar13) {
    if (__s_00 == (int *)0x0) {
      __s_00 = (int *)malloc((long)(int)uVar13 << 2);
    }
    else {
      __s_00 = (int *)realloc(__s_00,(long)(int)uVar13 << 2);
    }
    pVVar11->pArray = __s_00;
    if (__s_00 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    pVVar11->nCap = uVar13;
  }
  auVar8 = _DAT_0093d220;
  if (0 < (int)uVar13) {
    lVar12 = (ulong)uVar13 - 1;
    auVar18._8_4_ = (int)lVar12;
    auVar18._0_8_ = lVar12;
    auVar18._12_4_ = (int)((ulong)lVar12 >> 0x20);
    lVar12 = 0;
    auVar18 = auVar18 ^ _DAT_0093d220;
    auVar20 = _DAT_0093e4e0;
    auVar21 = _DAT_0093d210;
    do {
      auVar22 = auVar21 ^ auVar8;
      iVar19 = auVar18._4_4_;
      if ((bool)(~(auVar22._4_4_ == iVar19 && auVar18._0_4_ < auVar22._0_4_ ||
                  iVar19 < auVar22._4_4_) & 1)) {
        *(int *)((long)__s_00 + lVar12) = iVar14;
      }
      if ((auVar22._12_4_ != auVar18._12_4_ || auVar22._8_4_ <= auVar18._8_4_) &&
          auVar22._12_4_ <= auVar18._12_4_) {
        *(int *)((long)__s_00 + lVar12 + 4) = iVar14;
      }
      auVar22 = auVar20 ^ auVar8;
      iVar23 = auVar22._4_4_;
      if (iVar23 <= iVar19 && (iVar23 != iVar19 || auVar22._0_4_ <= auVar18._0_4_)) {
        *(int *)((long)__s_00 + lVar12 + 8) = iVar14;
        *(int *)((long)__s_00 + lVar12 + 0xc) = iVar14;
      }
      lVar15 = auVar21._8_8_;
      auVar21._0_8_ = auVar21._0_8_ + 4;
      auVar21._8_8_ = lVar15 + 4;
      lVar15 = auVar20._8_8_;
      auVar20._0_8_ = auVar20._0_8_ + 4;
      auVar20._8_8_ = lVar15 + 4;
      lVar12 = lVar12 + 0x10;
    } while ((ulong)(uVar13 + 3 >> 2) << 4 != lVar12);
  }
  pVVar11->nSize = uVar13;
  if (0 < pLVar2->nCols) {
    ppLVar3 = pLVar2->pColGrps;
    lVar12 = 0;
    do {
      pLVar4 = ppLVar3[lVar12];
      pVVar5 = pLVar4->vIns;
      iVar14 = pVVar5->nSize;
      iVar19 = (int)lVar12;
      if (0 < iVar14) {
        ppvVar6 = pVVar5->pArray;
        lVar15 = 0;
        do {
          iVar23 = *(int *)((long)ppvVar6[lVar15] + 0x24);
          lVar16 = (long)iVar23;
          if ((lVar16 < 0) || (pVVar11->nSize <= iVar23)) goto LAB_00824d0c;
          if (lVar12 < pVVar11->pArray[lVar16]) {
            pVVar11->pArray[lVar16] = iVar19;
            iVar14 = pVVar5->nSize;
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 < iVar14);
      }
      pVVar7 = pLVar4->vOuts;
      iVar23 = pVVar7->nSize;
      if (0 < iVar23) {
        ppvVar6 = pVVar7->pArray;
        lVar15 = 0;
        do {
          iVar14 = *(int *)((long)ppvVar6[lVar15] + 0x24);
          lVar16 = (long)iVar14;
          if ((lVar16 < 0) || (pVVar11->nSize <= iVar14)) goto LAB_00824d0c;
          if (lVar12 < __s_00[lVar16]) {
            __s_00[lVar16] = iVar19;
            iVar23 = pVVar7->nSize;
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 < iVar23);
        iVar14 = pVVar5->nSize;
      }
      if (0 < iVar14) {
        ppvVar6 = pVVar5->pArray;
        lVar15 = 0;
        do {
          iVar23 = *(int *)((long)ppvVar6[lVar15] + 0x24);
          lVar16 = (long)iVar23;
          if ((lVar16 < 0) || (pVVar10->nSize <= iVar23)) goto LAB_00824d0c;
          if (pVVar10->pArray[lVar16] < lVar12) {
            pVVar10->pArray[lVar16] = iVar19;
            iVar14 = pVVar5->nSize;
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 < iVar14);
        iVar23 = pVVar7->nSize;
      }
      if (0 < iVar23) {
        ppvVar6 = pVVar7->pArray;
        lVar15 = 0;
        do {
          iVar14 = *(int *)((long)ppvVar6[lVar15] + 0x24);
          lVar16 = (long)iVar14;
          if ((lVar16 < 0) || (pVVar10->nSize <= iVar14)) {
LAB_00824d0c:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          if (__s[lVar16] < lVar12) {
            __s[lVar16] = iVar19;
            iVar23 = pVVar7->nSize;
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 < iVar23);
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < pLVar2->nCols);
  }
  return;
}

Assistant:

void Llb_ManPrepareVarLimits( Llb_Man_t * p )
{
    Llb_Grp_t * pGroup;
    Aig_Obj_t * pVar;
    int i, k;
    assert( p->vVarBegs == NULL );
    assert( p->vVarEnds == NULL );
    p->vVarEnds = Vec_IntStart( Aig_ManObjNumMax(p->pAig) ); 
    p->vVarBegs = Vec_IntStart( Aig_ManObjNumMax(p->pAig) ); 
    Vec_IntFill( p->vVarBegs, Aig_ManObjNumMax(p->pAig), p->pMatrix->nCols );

    for ( i = 0; i < p->pMatrix->nCols; i++ )
    {
        pGroup = p->pMatrix->pColGrps[i];

        Vec_PtrForEachEntry( Aig_Obj_t *, pGroup->vIns, pVar, k )
            if ( Vec_IntEntry(p->vVarBegs, pVar->Id) > i )
                Vec_IntWriteEntry( p->vVarBegs, pVar->Id, i );
        Vec_PtrForEachEntry( Aig_Obj_t *, pGroup->vOuts, pVar, k )
            if ( Vec_IntEntry(p->vVarBegs, pVar->Id) > i )
                Vec_IntWriteEntry( p->vVarBegs, pVar->Id, i );

        Vec_PtrForEachEntry( Aig_Obj_t *, pGroup->vIns, pVar, k )
            if ( Vec_IntEntry(p->vVarEnds, pVar->Id) < i )
                Vec_IntWriteEntry( p->vVarEnds, pVar->Id, i );
        Vec_PtrForEachEntry( Aig_Obj_t *, pGroup->vOuts, pVar, k )
            if ( Vec_IntEntry(p->vVarEnds, pVar->Id) < i )
                Vec_IntWriteEntry( p->vVarEnds, pVar->Id, i );
    }
}